

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void GetFiles(string *pattern,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *files)

{
  _func_int_char_ptr_stat_ptr *this;
  char *pcVar1;
  ostream *poVar2;
  allocator<char> local_b9;
  value_type local_b8;
  ulong local_98;
  size_t i;
  byte local_79;
  LogMessage local_78;
  LogMessageVoidify local_65;
  int local_64;
  undefined1 auStack_60 [4];
  int r;
  glob_t g;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *pattern_local;
  
  g.gl_stat = (_func_int_char_ptr_stat_ptr *)files;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_64 = glob(pcVar1,0,(__errfunc *)0x0,(glob_t *)auStack_60);
  local_79 = 0;
  if (local_64 != 0 && local_64 != 3) {
    google::LogMessageVoidify::LogMessageVoidify(&local_65);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x272);
    local_79 = 1;
    poVar2 = google::LogMessage::stream(&local_78);
    poVar2 = std::operator<<(poVar2,"Check failed: (r == 0) || (r == GLOB_NOMATCH) ");
    poVar2 = std::operator<<(poVar2,": error matching ");
    poVar2 = std::operator<<(poVar2,(string *)pattern);
    google::LogMessageVoidify::operator&(&local_65,poVar2);
  }
  if ((local_79 & 1) == 0) {
    for (local_98 = 0; this = g.gl_stat, local_98 < _auStack_60; local_98 = local_98 + 1) {
      pcVar1 = *(char **)(g.gl_pathc + local_98 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    globfree((glob_t *)auStack_60);
    return;
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

static void GetFiles(const string& pattern, vector<string>* files) {
  files->clear();
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), 0, NULL, &g);
  CHECK((r == 0) || (r == GLOB_NOMATCH)) << ": error matching " << pattern;
  for (size_t i = 0; i < g.gl_pathc; i++) {
    files->push_back(string(g.gl_pathv[i]));
  }
  globfree(&g);
#elif defined(OS_WINDOWS)
  WIN32_FIND_DATAA data;
  HANDLE handle = FindFirstFileA(pattern.c_str(), &data);
  size_t index = pattern.rfind('\\');
  if (index == string::npos) {
    LOG(FATAL) << "No directory separator.";
  }
  const string dirname = pattern.substr(0, index + 1);
  if (handle == INVALID_HANDLE_VALUE) {
    // Finding no files is OK.
    return;
  }
  do {
    files->push_back(dirname + data.cFileName);
  } while (FindNextFileA(handle, &data));
  BOOL result = FindClose(handle);
  LOG_SYSRESULT(result);
#else
# error There is no way to do glob.
#endif
}